

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O3

int __thiscall cmCTestScriptHandler::RunConfigurationDashboard(cmCTestScriptHandler *this)

{
  string *filename;
  char *pcVar1;
  cmCTest *pcVar2;
  size_t sVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type sVar5;
  pointer pcVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  Status SVar10;
  ostream *poVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  uint uVar13;
  _Alloc_hider _Var14;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view arg;
  int retVal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ctestCommands;
  string command;
  string output;
  string cmakeFailedOuput;
  ostringstream cmCTestLog_msg_3;
  ostringstream cmCTestLog_msg;
  uint local_4b8;
  undefined4 local_4b4;
  string local_4b0;
  string local_490;
  string local_470;
  char *local_450;
  long local_448;
  char local_440;
  undefined7 uStack_43f;
  long *local_430;
  long local_420 [2];
  undefined1 local_410 [112];
  ios_base local_3a0 [264];
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  size_type local_278;
  pointer local_270;
  ios_base local_228 [504];
  
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  local_490._M_string_length = 0;
  local_490.field_2._M_local_buf[0] = '\0';
  paVar12 = &local_470.field_2;
  local_470._M_string_length = 0;
  local_470.field_2._M_local_buf[0] = '\0';
  local_470._M_dataplus._M_p = (pointer)paVar12;
  local_4b8 = CheckOutSourceDir(this);
  uVar13 = local_4b8;
  if (local_4b8 != 0) goto LAB_0058ae1b;
  local_4b8 = BackupDirectories(this);
  uVar13 = local_4b8;
  if (local_4b8 != 0) goto LAB_0058ae1b;
  if (this->EmptyBinDir == true) {
    bVar7 = EmptyBinaryDirectory(&this->BinaryDir);
    if (!bVar7) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"Problem removing the binary directory",0x25);
      std::ios::widen((char)(ostream *)local_298 + (char)*(undefined8 *)(local_298._0_8_ + -0x18));
      std::ostream::put((char)local_298);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x2a6;
      cmCTest::Log(pcVar2,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                   ,0x2a6,(char *)local_410._0_8_,false);
      if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
        operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
      std::ios_base::~ios_base(local_228);
    }
  }
  filename = &this->BinaryDir;
  bVar7 = cmsys::SystemTools::FileExists(filename);
  if (!bVar7) {
    sVar3 = (this->SourceDir)._M_string_length;
    if (sVar3 == (this->BinaryDir)._M_string_length) {
      if (sVar3 != 0) {
        iVar9 = bcmp((this->SourceDir)._M_dataplus._M_p,(this->BinaryDir)._M_dataplus._M_p,sVar3);
        if (iVar9 != 0) goto LAB_0058afa5;
      }
    }
    else {
LAB_0058afa5:
      SVar10 = cmsys::SystemTools::MakeDirectory(filename,(mode_t *)0x0);
      if (SVar10.Kind_ != Success) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_298,"Unable to create the binary directory:\n",filename);
        cmSystemTools::Error((string *)local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._0_8_ != &local_288) {
          operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
        }
        RestoreBackupDirectories(this);
        uVar13 = 7;
        goto LAB_0058ae1b;
      }
    }
  }
  if ((this->EmptyBinDir == true) &&
     (sVar3 = (this->SourceDir)._M_string_length, sVar3 == (this->BinaryDir)._M_string_length)) {
    if (sVar3 != 0) {
      iVar9 = bcmp((this->SourceDir)._M_dataplus._M_p,(this->BinaryDir)._M_dataplus._M_p,sVar3);
      if (iVar9 != 0) goto LAB_0058b06e;
    }
    if ((this->CVSCheckOut)._M_string_length == 0) {
      local_298._0_8_ = &local_288;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_298,
                 "You have specified the source and binary directories to be the same (an in source build). You have also specified that the binary directory is to be erased. This means that the source will have to be checked out from CVS. But you have not specified CTEST_CVS_CHECKOUT"
                 ,"");
      cmSystemTools::Error((string *)local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._0_8_ != &local_288) {
        operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
      }
      uVar13 = 8;
      goto LAB_0058ae1b;
    }
    local_4b8 = CheckOutSourceDir(this);
    if (local_4b8 != 0) {
      RestoreBackupDirectories(this);
      uVar13 = local_4b8;
      goto LAB_0058ae1b;
    }
  }
LAB_0058b06e:
  PerformExtraUpdates(this);
  local_4b8 = 0;
  if ((this->InitialCache)._M_string_length != 0) {
    bVar7 = WriteInitialCache(filename,&this->InitialCache);
    if (!bVar7) {
      uVar13 = 9;
      RestoreBackupDirectories(this);
      goto LAB_0058ae1b;
    }
  }
  local_450 = &local_440;
  local_448 = 0;
  local_440 = '\0';
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this->CMakeCmd)._M_string_length;
  local_4b4 = (undefined4)CONCAT71((int7)((ulong)paVar12 >> 8),1);
  if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
    local_298._8_8_ = (this->CMakeCmd)._M_dataplus._M_p;
    local_288._M_allocated_capacity = 2;
    local_288._8_8_ = (long)"Ignoring extra path from command line:\n \"" + 0x27;
    local_270 = (this->SourceDir)._M_dataplus._M_p;
    local_278 = (this->SourceDir)._M_string_length;
    views._M_len = 3;
    views._M_array = (iterator)local_298;
    local_298._0_8_ = paVar4;
    cmCatViews_abi_cxx11_((string *)local_410,views);
    std::__cxx11::string::operator=((string *)&local_490,(string *)local_410);
    pcVar1 = local_410 + 0x10;
    if ((char *)local_410._0_8_ != pcVar1) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    local_470._M_string_length = 0;
    *local_470._M_dataplus._M_p = '\0';
    std::__cxx11::string::append((char *)&local_490);
    local_4b8 = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"Run cmake command: ",0x13);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,local_490._M_dataplus._M_p,local_490._M_string_length)
    ;
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0x2e4,(char *)local_410._0_8_,false);
    if ((char *)local_410._0_8_ != pcVar1) {
      operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
    std::ios_base::~ios_base(local_228);
    bVar7 = cmSystemTools::RunSingleCommand
                      (&local_490,&local_470,&local_470,(int *)&local_4b8,
                       (this->BinaryDir)._M_dataplus._M_p,
                       (this->super_cmCTestGenericHandler).HandlerVerbose,(cmDuration)0x0);
    sVar5 = (this->CMOutFile)._M_string_length;
    if (sVar5 != 0) {
      pcVar6 = (this->CMOutFile)._M_dataplus._M_p;
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_4b0,pcVar6,pcVar6 + sVar5);
      bVar8 = cmsys::SystemTools::FileIsFullPath(&local_4b0);
      if (!bVar8) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,filename,"/");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_298,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_410,&local_4b0);
        std::__cxx11::string::operator=((string *)&local_4b0,(string *)local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._0_8_ != &local_288) {
          operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
        }
        if ((char *)local_410._0_8_ != pcVar1) {
          operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"Write CMake output to file: ",0x1c);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_298,local_4b0._M_dataplus._M_p,
                           local_4b0._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar11);
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                   ,0x2f1,(char *)local_410._0_8_,false);
      if ((char *)local_410._0_8_ != pcVar1) {
        operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
      std::ios_base::~ios_base(local_228);
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_298,&local_4b0,false,None);
      if ((*(byte *)((long)&local_278 + *(long *)(local_298._0_8_ + -0x18)) & 5) == 0) {
        std::operator<<((ostream *)local_298,local_470._M_dataplus._M_p);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_410,"Cannot open CMake output file: ",0x1f);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_410,local_4b0._M_dataplus._M_p,
                             local_4b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," for writing",0xc);
        std::endl<char,std::char_traits<char>>(poVar11);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                     ,0x2f8,(char *)local_430,false);
        if (local_430 != local_420) {
          operator_delete(local_430,local_420[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
        std::ios_base::~ios_base(local_3a0);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
    }
    if (!bVar7 || local_4b8 != 0) {
      std::__cxx11::string::_M_assign((string *)&local_450);
      local_4b4 = 0;
    }
  }
  arg._M_str = (this->CTestCmd)._M_dataplus._M_p;
  arg._M_len = (this->CTestCmd)._M_string_length;
  cmExpandedList_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_4b0,arg,false);
  if (local_4b0._M_dataplus._M_p != (pointer)local_4b0._M_string_length) {
    _Var14._M_p = local_4b0._M_dataplus._M_p;
    do {
      std::__cxx11::string::_M_assign((string *)&local_490);
      local_470._M_string_length = 0;
      *local_470._M_dataplus._M_p = '\0';
      local_4b8 = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"Run ctest command: ",0x13);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_298,local_490._M_dataplus._M_p,
                           local_490._M_string_length);
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                   ,0x30a,(char *)local_410._0_8_,false);
      if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
        operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
      std::ios_base::~ios_base(local_228);
      bVar7 = cmSystemTools::RunSingleCommand
                        (&local_490,&local_470,&local_470,(int *)&local_4b8,
                         (this->BinaryDir)._M_dataplus._M_p,
                         (this->super_cmCTestGenericHandler).HandlerVerbose,(cmDuration)0x0);
      if (((byte)local_4b4 & bVar7) != 1) {
LAB_0058b722:
        RestoreBackupDirectories(this);
        if ((char)local_4b4 == '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_298,"Unable to run cmake:",0x14);
          std::ios::widen((char)(ostream *)local_298 +
                          (char)*(undefined8 *)(local_298._0_8_ + -0x18));
          std::ostream::put((char)local_298);
          poVar11 = (ostream *)std::ostream::flush();
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_450,local_448);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                       ,0x315,(char *)local_410._0_8_,false);
          if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
            operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
          std::ios_base::~ios_base(local_228);
          uVar13 = 10;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_298,"Unable to run ctest:",0x14);
          std::ios::widen((char)(ostream *)local_298 +
                          (char)*(undefined8 *)(local_298._0_8_ + -0x18));
          std::ostream::put((char)local_298);
          poVar11 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"command: ",9);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_490._M_dataplus._M_p,local_490._M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          poVar11 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"output: ",8);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_470._M_dataplus._M_p,local_470._M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                       ,0x31b,(char *)local_410._0_8_,false);
          if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
            operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
          std::ios_base::~ios_base(local_228);
          uVar13 = 0xb;
          if (bVar7 != false) {
            uVar13 = local_4b8 * 100;
          }
        }
        goto LAB_0058b9f0;
      }
      if ((local_4b8 & 4) != 0) {
        bVar7 = true;
        goto LAB_0058b722;
      }
      _Var14._M_p = _Var14._M_p + 0x20;
    } while (_Var14._M_p != (pointer)local_4b0._M_string_length);
  }
  uVar13 = 0;
  if (this->Backup == true) {
    cmsys::SystemTools::RemoveADirectory(&this->BackupSourceDir);
    cmsys::SystemTools::RemoveADirectory(&this->BackupBinaryDir);
  }
LAB_0058b9f0:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_4b0);
  if (local_450 != &local_440) {
    operator_delete(local_450,CONCAT71(uStack_43f,local_440) + 1);
  }
LAB_0058ae1b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,
                    CONCAT71(local_470.field_2._M_allocated_capacity._1_7_,
                             local_470.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,
                    CONCAT71(local_490.field_2._M_allocated_capacity._1_7_,
                             local_490.field_2._M_local_buf[0]) + 1);
  }
  return uVar13;
}

Assistant:

int cmCTestScriptHandler::RunConfigurationDashboard()
{
  // local variables
  std::string command;
  std::string output;
  int retVal;
  bool res;

  // make sure the src directory is there, if it isn't then we might be able
  // to check it out from cvs
  retVal = this->CheckOutSourceDir();
  if (retVal) {
    return retVal;
  }

  // backup the dirs if requested
  retVal = this->BackupDirectories();
  if (retVal) {
    return retVal;
  }

  // clear the binary directory?
  if (this->EmptyBinDir) {
    if (!cmCTestScriptHandler::EmptyBinaryDirectory(this->BinaryDir)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Problem removing the binary directory" << std::endl);
    }
  }

  // make sure the binary directory exists if it isn't the srcdir
  if (!cmSystemTools::FileExists(this->BinaryDir) &&
      this->SourceDir != this->BinaryDir) {
    if (!cmSystemTools::MakeDirectory(this->BinaryDir)) {
      cmSystemTools::Error("Unable to create the binary directory:\n" +
                           this->BinaryDir);
      this->RestoreBackupDirectories();
      return 7;
    }
  }

  // if the binary directory and the source directory are the same,
  // and we are starting with an empty binary directory, then that means
  // we must check out the source tree
  if (this->EmptyBinDir && this->SourceDir == this->BinaryDir) {
    // make sure we have the required info
    if (this->CVSCheckOut.empty()) {
      cmSystemTools::Error(
        "You have specified the source and binary "
        "directories to be the same (an in source build). You have also "
        "specified that the binary directory is to be erased. This means "
        "that the source will have to be checked out from CVS. But you have "
        "not specified CTEST_CVS_CHECKOUT");
      return 8;
    }

    // we must now checkout the src dir
    retVal = this->CheckOutSourceDir();
    if (retVal) {
      this->RestoreBackupDirectories();
      return retVal;
    }
  }

  // backup the dirs if requested
  retVal = this->PerformExtraUpdates();
  if (retVal) {
    return retVal;
  }

  // put the initial cache into the bin dir
  if (!this->InitialCache.empty()) {
    if (!cmCTestScriptHandler::WriteInitialCache(this->BinaryDir,
                                                 this->InitialCache)) {
      this->RestoreBackupDirectories();
      return 9;
    }
  }

  // do an initial cmake to setup the DartConfig file
  int cmakeFailed = 0;
  std::string cmakeFailedOuput;
  if (!this->CMakeCmd.empty()) {
    command = cmStrCat(this->CMakeCmd, " \"", this->SourceDir);
    output.clear();
    command += "\"";
    retVal = 0;
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Run cmake command: " << command << std::endl);
    res = cmSystemTools::RunSingleCommand(
      command, &output, &output, &retVal, this->BinaryDir.c_str(),
      this->HandlerVerbose, cmDuration::zero() /*this->TimeOut*/);

    if (!this->CMOutFile.empty()) {
      std::string cmakeOutputFile = this->CMOutFile;
      if (!cmSystemTools::FileIsFullPath(cmakeOutputFile)) {
        cmakeOutputFile = this->BinaryDir + "/" + cmakeOutputFile;
      }

      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 "Write CMake output to file: " << cmakeOutputFile
                                                << std::endl);
      cmGeneratedFileStream fout(cmakeOutputFile);
      if (fout) {
        fout << output.c_str();
      } else {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Cannot open CMake output file: "
                     << cmakeOutputFile << " for writing" << std::endl);
      }
    }
    if (!res || retVal != 0) {
      // even if this fails continue to the next step
      cmakeFailed = 1;
      cmakeFailedOuput = output;
    }
  }

  // run ctest, it may be more than one command in here
  std::vector<std::string> ctestCommands = cmExpandedList(this->CTestCmd);
  // for each variable/argument do a putenv
  for (std::string const& ctestCommand : ctestCommands) {
    command = ctestCommand;
    output.clear();
    retVal = 0;
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Run ctest command: " << command << std::endl);
    res = cmSystemTools::RunSingleCommand(
      command, &output, &output, &retVal, this->BinaryDir.c_str(),
      this->HandlerVerbose, cmDuration::zero() /*this->TimeOut*/);

    // did something critical fail in ctest
    if (!res || cmakeFailed || retVal & cmCTest::BUILD_ERRORS) {
      this->RestoreBackupDirectories();
      if (cmakeFailed) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Unable to run cmake:" << std::endl
                                          << cmakeFailedOuput << std::endl);
        return 10;
      }
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to run ctest:" << std::endl
                                        << "command: " << command << std::endl
                                        << "output: " << output << std::endl);
      if (!res) {
        return 11;
      }
      return retVal * 100;
    }
  }

  // if all was successful, delete the backup dirs to free up disk space
  if (this->Backup) {
    cmSystemTools::RemoveADirectory(this->BackupSourceDir);
    cmSystemTools::RemoveADirectory(this->BackupBinaryDir);
  }

  return 0;
}